

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O0

int av1_cost_coeffs_txb_laplacian
              (MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,TXB_CTX *txb_ctx,
              int reduced_tx_set_used,int adjust_eob)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  SCAN_ORDER *pSVar4;
  long lVar5;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  int *in_R9;
  int in_stack_00000010;
  TX_CLASS tx_class;
  MACROBLOCKD *xd;
  LV_MAP_COEFF_COST *coeff_costs;
  PLANE_TYPE plane_type;
  TX_SIZE txs_ctx;
  tran_low_t *dqcoeff;
  tran_low_t *qcoeff;
  tran_low_t *tcoeff;
  int16_t *scan;
  SCAN_ORDER *scan_order;
  int eob;
  macroblock_plane *p;
  int cost;
  LV_MAP_EOB_COST *eob_costs;
  int eob_multi_size;
  int txb_skip_ctx;
  undefined6 in_stack_ffffffffffffff30;
  MACROBLOCK *in_stack_ffffffffffffff38;
  tran_low_t *in_stack_ffffffffffffff40;
  tran_low_t *in_stack_ffffffffffffff48;
  MACROBLOCK *in_stack_ffffffffffffff50;
  uint local_9c;
  long local_98;
  int *local_90;
  byte local_82;
  byte local_81;
  int local_80;
  int local_7c;
  long local_78;
  int local_70;
  int local_6c;
  long local_68;
  int local_60;
  int local_5c;
  TX_CLASS local_52;
  byte local_51;
  long local_50;
  long local_48;
  byte local_3d;
  uint local_3c;
  int *local_38;
  byte local_29;
  int local_28;
  int local_24;
  long local_20;
  
  local_98 = in_RDI + (long)in_ESI * 0x88;
  local_9c = (uint)*(ushort *)(*(long *)(local_98 + 0x20) + (long)in_EDX * 2);
  local_90 = in_R9;
  local_82 = in_R8B;
  local_81 = in_CL;
  local_80 = in_EDX;
  local_7c = in_ESI;
  local_78 = in_RDI;
  if (in_stack_00000010 != 0) {
    pSVar4 = get_scan('\0','\0');
    in_stack_ffffffffffffff50 = (MACROBLOCK *)pSVar4->scan;
    in_stack_ffffffffffffff48 =
         (tran_low_t *)(*(long *)(local_98 + 0x18) + (long)(local_80 << 4) * 4);
    in_stack_ffffffffffffff40 =
         (tran_low_t *)(*(long *)(local_98 + 0x10) + (long)(local_80 << 4) * 4);
    in_stack_ffffffffffffff38 = (MACROBLOCK *)(*(long *)(local_98 + 8) + (long)(local_80 << 4) * 4);
    iVar3 = av1_get_tx_scale(local_81);
    update_coeff_eob_fast
              ((int *)&local_9c,iVar3,*(int16_t **)(local_98 + 0x80),
               (int16_t *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40,(tran_low_t *)in_stack_ffffffffffffff38);
    *(short *)(*(long *)(local_98 + 0x20) + (long)local_80 * 2) = (short)local_9c;
  }
  bVar1 = get_txsize_entropy_ctx(local_81);
  bVar2 = get_plane_type(local_7c);
  lVar5 = local_78 + 0xb9d8 + (ulong)bVar1 * 0x1d80 + (ulong)bVar2 * 0xec0;
  if (local_9c == 0) {
    local_70 = *(int *)(lVar5 + 4 + (long)*local_90 * 8);
  }
  else {
    local_50 = local_78 + 0x1a0;
    local_52 = ""[local_82];
    local_20 = local_78;
    local_24 = local_7c;
    local_28 = local_80;
    local_29 = local_81;
    local_38 = local_90;
    local_3c = local_9c;
    local_51 = local_82;
    local_5c = *local_90;
    local_60 = (int)""[local_81];
    local_68 = local_78 + 0x14d58 + (long)local_60 * 0xb0 + (ulong)bVar2 * 0x58;
    local_6c = *(int *)(lVar5 + (long)local_5c * 8);
    local_48 = lVar5;
    local_3d = bVar2;
    iVar3 = get_tx_type_cost(in_stack_ffffffffffffff38,
                             (MACROBLOCKD *)
                             CONCAT17(bVar1,CONCAT16(bVar2,in_stack_ffffffffffffff30)),
                             (int)((ulong)lVar5 >> 0x20),(TX_SIZE)((ulong)lVar5 >> 0x18),
                             (TX_TYPE)((ulong)lVar5 >> 0x10),(int)((ulong)local_50 >> 0x20));
    local_6c = iVar3 + local_6c;
    iVar3 = get_eob_cost((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                         (LV_MAP_EOB_COST *)in_stack_ffffffffffffff38,
                         (LV_MAP_COEFF_COST *)
                         CONCAT17(bVar1,CONCAT16(bVar2,in_stack_ffffffffffffff30)),
                         (TX_CLASS)((ulong)lVar5 >> 0x38));
    local_6c = iVar3 + local_6c;
    local_70 = av1_cost_coeffs_txb_estimate
                         (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                          (int)in_stack_ffffffffffffff48,
                          (TX_SIZE)((ulong)in_stack_ffffffffffffff40 >> 0x38),
                          (TX_TYPE)((ulong)in_stack_ffffffffffffff40 >> 0x30));
    local_70 = local_70 + local_6c;
  }
  return local_70;
}

Assistant:

int av1_cost_coeffs_txb_laplacian(const MACROBLOCK *x, const int plane,
                                  const int block, const TX_SIZE tx_size,
                                  const TX_TYPE tx_type,
                                  const TXB_CTX *const txb_ctx,
                                  const int reduced_tx_set_used,
                                  const int adjust_eob) {
  const struct macroblock_plane *p = &x->plane[plane];
  int eob = p->eobs[block];

  if (adjust_eob) {
    const SCAN_ORDER *scan_order = get_scan(tx_size, tx_type);
    const int16_t *scan = scan_order->scan;
    tran_low_t *tcoeff = p->coeff + BLOCK_OFFSET(block);
    tran_low_t *qcoeff = p->qcoeff + BLOCK_OFFSET(block);
    tran_low_t *dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);
    update_coeff_eob_fast(&eob, av1_get_tx_scale(tx_size), p->dequant_QTX, scan,
                          tcoeff, qcoeff, dqcoeff);
    p->eobs[block] = eob;
  }

  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const LV_MAP_COEFF_COST *const coeff_costs =
      &x->coeff_costs.coeff_costs[txs_ctx][plane_type];
  if (eob == 0) {
    return coeff_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }

  const MACROBLOCKD *const xd = &x->e_mbd;
  const TX_CLASS tx_class = tx_type_to_class[tx_type];

  return warehouse_efficients_txb_laplacian(
      x, plane, block, tx_size, txb_ctx, eob, plane_type, coeff_costs, xd,
      tx_type, tx_class, reduced_tx_set_used);
}